

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void __thiscall duckdb::Executor::WorkOnTasks(Executor *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar1;
  int iVar2;
  DatabaseInstance *this_01;
  TaskScheduler *pTVar3;
  type token;
  Task *pTVar4;
  ConcurrentQueue *this_02;
  shared_ptr<duckdb::Task,_true> task_from_producer;
  shared_ptr<duckdb::Task,_true> local_38;
  
  this_01 = DatabaseInstance::GetDatabase(this->context);
  pTVar3 = DatabaseInstance::GetScheduler(this_01);
  local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    token = unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>,_true>::
            operator*(&this->producer);
    this_02 = (ConcurrentQueue *)&pTVar3->queue;
    unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>::
    operator->(&pTVar3->queue);
    bVar1 = ConcurrentQueue::DequeueFromProducer(this_02,token,&local_38);
    if (!bVar1) break;
    pTVar4 = shared_ptr<duckdb::Task,_true>::operator->(&local_38);
    iVar2 = (*pTVar4->_vptr_Task[2])(pTVar4,0);
    if ((char)iVar2 == '\x03') {
      pTVar4 = shared_ptr<duckdb::Task,_true>::operator->(&local_38);
      (*pTVar4->_vptr_Task[3])(pTVar4);
    }
    this_00._M_pi =
         local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
  }
  if (local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void Executor::WorkOnTasks() {
	auto &scheduler = TaskScheduler::GetScheduler(context);

	shared_ptr<Task> task_from_producer;
	while (scheduler.GetTaskFromProducer(*producer, task_from_producer)) {
		auto res = task_from_producer->Execute(TaskExecutionMode::PROCESS_ALL);
		if (res == TaskExecutionResult::TASK_BLOCKED) {
			task_from_producer->Deschedule();
		}
		task_from_producer.reset();
	}
}